

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_true>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  AABBNodeMB4D *node1;
  ulong uVar23;
  ulong uVar24;
  RTCIntersectFunctionN p_Var25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  uint uVar29;
  ulong *puVar30;
  undefined1 (*pauVar31) [32];
  bool bVar32;
  bool bVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2608[0] != 8) {
    auVar39 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar54 = ZEXT816(0) << 0x40;
    uVar35 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54),5);
    uVar24 = vpcmpeqd_avx512vl(auVar39,(undefined1  [32])valid_i->field_0);
    uVar35 = uVar35 & uVar24;
    bVar34 = (byte)uVar35;
    if (bVar34 != 0) {
      auVar39 = *(undefined1 (*) [32])(ray + 0x80);
      auVar40 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar37 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar43._8_4_ = 0x7fffffff;
      auVar43._0_8_ = 0x7fffffff7fffffff;
      auVar43._12_4_ = 0x7fffffff;
      auVar43._16_4_ = 0x7fffffff;
      auVar43._20_4_ = 0x7fffffff;
      auVar43._24_4_ = 0x7fffffff;
      auVar43._28_4_ = 0x7fffffff;
      auVar38 = vandps_avx(auVar39,auVar43);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      auVar45._16_4_ = 0x219392ef;
      auVar45._20_4_ = 0x219392ef;
      auVar45._24_4_ = 0x219392ef;
      auVar45._28_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar38,auVar45,1);
      bVar33 = (bool)((byte)uVar24 & 1);
      auVar38._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._0_4_;
      bVar33 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar38._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._4_4_;
      bVar33 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar38._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._8_4_;
      bVar33 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar38._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._12_4_;
      bVar33 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar38._16_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._16_4_;
      bVar33 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar38._20_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._20_4_;
      bVar33 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar38._24_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._24_4_;
      bVar33 = SUB81(uVar24 >> 7,0);
      auVar38._28_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar39._28_4_;
      auVar39 = vandps_avx(auVar37,auVar43);
      uVar24 = vcmpps_avx512vl(auVar39,auVar45,1);
      bVar33 = (bool)((byte)uVar24 & 1);
      auVar39._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._0_4_;
      bVar33 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._4_4_;
      bVar33 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._8_4_;
      bVar33 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._12_4_;
      bVar33 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._16_4_;
      bVar33 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._20_4_;
      bVar33 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._24_4_;
      bVar33 = SUB81(uVar24 >> 7,0);
      auVar39._28_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar37._28_4_;
      auVar44._8_4_ = 0x3f800000;
      auVar44._0_8_ = &DAT_3f8000003f800000;
      auVar44._12_4_ = 0x3f800000;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar37 = vrcp14ps_avx512vl(auVar38);
      auVar13 = vfnmadd213ps_fma(auVar38,auVar37,auVar44);
      auVar38 = vrcp14ps_avx512vl(auVar39);
      auVar14 = vfnmadd213ps_fma(auVar39,auVar38,auVar44);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar59 = ZEXT3264(local_1e80);
      auVar39 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar54));
      local_1e60._0_4_ = (uint)(bVar34 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar34 & 1) * 0x7f800000
      ;
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      local_1e60._4_4_ = (uint)bVar33 * auVar39._4_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)((byte)(uVar35 >> 2) & 1);
      local_1e60._8_4_ = (uint)bVar33 * auVar39._8_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)((byte)(uVar35 >> 3) & 1);
      local_1e60._12_4_ = (uint)bVar33 * auVar39._12_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)((byte)(uVar35 >> 4) & 1);
      local_1e60._16_4_ = (uint)bVar33 * auVar39._16_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)((byte)(uVar35 >> 5) & 1);
      local_1e60._20_4_ = (uint)bVar33 * auVar39._20_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = (bool)((byte)(uVar35 >> 6) & 1);
      local_1e60._24_4_ = (uint)bVar33 * auVar39._24_4_ | (uint)!bVar33 * 0x7f800000;
      bVar33 = SUB81(uVar35 >> 7,0);
      local_1e60._28_4_ = (uint)bVar33 * auVar39._28_4_ | (uint)!bVar33 * 0x7f800000;
      auVar60 = ZEXT3264(local_1e60);
      bVar28 = ~bVar34;
      auVar39 = *(undefined1 (*) [32])ray;
      auVar46._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      auVar46._8_4_ = auVar39._8_4_ ^ 0x80000000;
      auVar46._12_4_ = auVar39._12_4_ ^ 0x80000000;
      auVar46._16_4_ = auVar39._16_4_ ^ 0x80000000;
      auVar46._20_4_ = auVar39._20_4_ ^ 0x80000000;
      auVar46._24_4_ = auVar39._24_4_ ^ 0x80000000;
      auVar46._28_4_ = auVar39._28_4_ ^ 0x80000000;
      auVar39 = *(undefined1 (*) [32])(ray + 0x20);
      auVar47._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      auVar47._8_4_ = auVar39._8_4_ ^ 0x80000000;
      auVar47._12_4_ = auVar39._12_4_ ^ 0x80000000;
      auVar47._16_4_ = auVar39._16_4_ ^ 0x80000000;
      auVar47._20_4_ = auVar39._20_4_ ^ 0x80000000;
      auVar47._24_4_ = auVar39._24_4_ ^ 0x80000000;
      auVar47._28_4_ = auVar39._28_4_ ^ 0x80000000;
      auVar39 = *(undefined1 (*) [32])(ray + 0x40);
      auVar42._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
      auVar42._8_4_ = auVar39._8_4_ ^ 0x80000000;
      auVar42._12_4_ = auVar39._12_4_ ^ 0x80000000;
      auVar42._16_4_ = auVar39._16_4_ ^ 0x80000000;
      auVar42._20_4_ = auVar39._20_4_ ^ 0x80000000;
      auVar42._24_4_ = auVar39._24_4_ ^ 0x80000000;
      auVar42._28_4_ = auVar39._28_4_ ^ 0x80000000;
      auVar39 = vandps_avx(auVar40,auVar43);
      uVar24 = vcmpps_avx512vl(auVar39,auVar45,1);
      bVar33 = (bool)((byte)uVar24 & 1);
      auVar41._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._0_4_;
      bVar33 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar41._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._4_4_;
      bVar33 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar41._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._8_4_;
      bVar33 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar41._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._12_4_;
      bVar33 = (bool)((byte)(uVar24 >> 4) & 1);
      auVar41._16_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._16_4_;
      bVar33 = (bool)((byte)(uVar24 >> 5) & 1);
      auVar41._20_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._20_4_;
      bVar33 = (bool)((byte)(uVar24 >> 6) & 1);
      auVar41._24_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._24_4_;
      bVar33 = SUB81(uVar24 >> 7,0);
      auVar41._28_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar40._28_4_;
      auVar39 = vrcp14ps_avx512vl(auVar41);
      auVar15 = vfnmadd213ps_fma(auVar41,auVar39,auVar44);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar39,auVar39);
      auVar57 = ZEXT1664(auVar15);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54));
      bVar33 = (bool)((byte)(uVar35 >> 1) & 1);
      bVar32 = (bool)((byte)(uVar35 >> 2) & 1);
      bVar3 = (bool)((byte)(uVar35 >> 3) & 1);
      bVar4 = (bool)((byte)(uVar35 >> 4) & 1);
      bVar5 = (bool)((byte)(uVar35 >> 5) & 1);
      bVar6 = (bool)((byte)(uVar35 >> 6) & 1);
      bVar8 = SUB81(uVar35 >> 7,0);
      auVar61 = ZEXT3264(CONCAT428((uint)bVar8 * auVar40._28_4_ | (uint)!bVar8 * auVar39._28_4_,
                                   CONCAT424((uint)bVar6 * auVar40._24_4_ |
                                             (uint)!bVar6 * auVar39._24_4_,
                                             CONCAT420((uint)bVar5 * auVar40._20_4_ |
                                                       (uint)!bVar5 * auVar39._20_4_,
                                                       CONCAT416((uint)bVar4 * auVar40._16_4_ |
                                                                 (uint)!bVar4 * auVar39._16_4_,
                                                                 CONCAT412((uint)bVar3 *
                                                                           auVar40._12_4_ |
                                                                           (uint)!bVar3 *
                                                                           auVar39._12_4_,
                                                                           CONCAT48((uint)bVar32 *
                                                                                    auVar40._8_4_ |
                                                                                    (uint)!bVar32 *
                                                                                    auVar39._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar33 * auVar40._4_4_ |
                                                  (uint)!bVar33 * auVar39._4_4_,
                                                  (uint)(bVar34 & 1) * auVar40._0_4_ |
                                                  (uint)!(bool)(bVar34 & 1) * auVar39._0_4_))))))));
      auVar54 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar37,auVar37);
      auVar56 = ZEXT1664(auVar54);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar38,auVar38);
      auVar58 = ZEXT1664(auVar13);
      puVar30 = local_2608 + 1;
      local_2610 = 0xfffffffffffffff8;
      pauVar31 = (undefined1 (*) [32])local_1e40;
      auVar39 = vmulps_avx512vl(ZEXT1632(auVar54),auVar46);
      auVar62 = ZEXT3264(auVar39);
      auVar39 = vmulps_avx512vl(ZEXT1632(auVar15),auVar47);
      auVar63 = ZEXT3264(auVar39);
      auVar39 = vmulps_avx512vl(ZEXT1632(auVar13),auVar42);
      auVar64 = ZEXT3264(auVar39);
      do {
        pauVar31 = pauVar31 + -1;
        uVar35 = puVar30[-1];
        puVar30 = puVar30 + -1;
        bVar33 = true;
        if (uVar35 != 0xfffffffffffffff8) {
          auVar39 = *pauVar31;
          local_26e0 = auVar61._0_32_;
          uVar10 = vcmpps_avx512vl(auVar39,local_26e0,1);
          if ((char)uVar10 != '\0') {
LAB_007b9793:
            uVar29 = (uint)uVar35;
            local_2660 = auVar56._0_32_;
            local_2700 = auVar62._0_32_;
            local_2680 = auVar57._0_32_;
            local_2720 = auVar63._0_32_;
            local_26a0 = auVar58._0_32_;
            local_2740 = auVar64._0_32_;
            local_26c0 = auVar60._0_32_;
            if ((uVar35 & 8) == 0) goto code_r0x007b979d;
            if (uVar35 == 0xfffffffffffffff8) goto LAB_007b9913;
            uVar10 = vcmpps_avx512vl(local_26e0,auVar39,6);
            if ((char)uVar10 != '\0') {
              uVar24 = (ulong)(uVar29 & 0xf);
              bVar27 = bVar28;
              if (uVar24 != 8) {
                bVar27 = ~bVar28;
                uVar23 = 1;
                do {
                  local_2788.geomID = *(uint *)(((uVar35 & 0xfffffffffffffff0) - 8) + uVar23 * 8);
                  local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                  uVar29 = local_2758->mask;
                  auVar40._4_4_ = uVar29;
                  auVar40._0_4_ = uVar29;
                  auVar40._8_4_ = uVar29;
                  auVar40._12_4_ = uVar29;
                  auVar40._16_4_ = uVar29;
                  auVar40._20_4_ = uVar29;
                  auVar40._24_4_ = uVar29;
                  auVar40._28_4_ = uVar29;
                  uVar10 = vptestmd_avx512vl(auVar40,*(undefined1 (*) [32])(ray + 0x120));
                  bVar26 = (byte)uVar10 & bVar27;
                  if (bVar26 == 0) {
                    bVar26 = 0xff;
                  }
                  else {
                    local_2788.primID = *(uint *)(((uVar35 & 0xfffffffffffffff0) - 4) + uVar23 * 8);
                    local_2640 = vpmovm2d_avx512vl((ulong)bVar26);
                    local_2788.valid = (int *)local_2640;
                    local_2788.geometryUserPtr = local_2758->userPtr;
                    local_2788.context = context->user;
                    local_2788.N = 8;
                    local_2750 = 0;
                    local_2748 = context->args;
                    p_Var25 = local_2748->intersect;
                    if (p_Var25 == (RTCIntersectFunctionN)0x0) {
                      p_Var25 = (RTCIntersectFunctionN)
                                local_2758[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_2788.rayhit = (RTCRayHitN *)ray;
                    (*p_Var25)(&local_2788);
                    uVar10 = vcmpps_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                             *(undefined1 (*) [32])(ray + 0x100),0xe);
                    bVar26 = ~(byte)uVar10;
                    auVar56 = ZEXT3264(local_2660);
                    auVar57 = ZEXT3264(local_2680);
                    auVar58 = ZEXT3264(local_26a0);
                    auVar59 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar60 = ZEXT3264(local_26c0);
                    auVar61 = ZEXT3264(local_26e0);
                    auVar62 = ZEXT3264(local_2700);
                    auVar63 = ZEXT3264(local_2720);
                    auVar64 = ZEXT3264(local_2740);
                  }
                  bVar27 = bVar27 & bVar26;
                } while ((bVar27 != 0) &&
                        (bVar33 = uVar23 < uVar24 - 8, uVar23 = uVar23 + 1, bVar33));
                bVar27 = ~bVar27;
              }
              bVar33 = true;
              bVar28 = bVar28 | bVar27;
              if (bVar28 != 0xff) {
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar33 = (bool)(bVar28 >> 1 & 1);
                bVar32 = (bool)(bVar28 >> 2 & 1);
                bVar3 = (bool)(bVar28 >> 3 & 1);
                bVar4 = (bool)(bVar28 >> 4 & 1);
                bVar5 = (bool)(bVar28 >> 5 & 1);
                bVar6 = (bool)(bVar28 >> 6 & 1);
                auVar61 = ZEXT3264(CONCAT428((uint)(bVar28 >> 7) * auVar39._28_4_ |
                                             (uint)!(bool)(bVar28 >> 7) * auVar61._28_4_,
                                             CONCAT424((uint)bVar6 * auVar39._24_4_ |
                                                       (uint)!bVar6 * auVar61._24_4_,
                                                       CONCAT420((uint)bVar5 * auVar39._20_4_ |
                                                                 (uint)!bVar5 * auVar61._20_4_,
                                                                 CONCAT416((uint)bVar4 *
                                                                           auVar39._16_4_ |
                                                                           (uint)!bVar4 *
                                                                           auVar61._16_4_,
                                                                           CONCAT412((uint)bVar3 *
                                                                                     auVar39._12_4_
                                                                                     | (uint)!bVar3
                                                                                       * auVar61.
                                                  _12_4_,CONCAT48((uint)bVar32 * auVar39._8_4_ |
                                                                  (uint)!bVar32 * auVar61._8_4_,
                                                                  CONCAT44((uint)bVar33 *
                                                                           auVar39._4_4_ |
                                                                           (uint)!bVar33 *
                                                                           auVar61._4_4_,
                                                                           (uint)(bVar28 & 1) *
                                                                           auVar39._0_4_ |
                                                                           (uint)!(bool)(bVar28 & 1)
                                                                           * auVar61._0_4_))))))));
                goto LAB_007b9910;
              }
              goto LAB_007b9913;
            }
          }
LAB_007b9910:
          bVar33 = false;
        }
LAB_007b9913:
      } while (!bVar33);
      bVar28 = bVar28 & bVar34;
      bVar33 = (bool)(bVar28 >> 1 & 1);
      bVar32 = (bool)(bVar28 >> 2 & 1);
      bVar3 = (bool)(bVar28 >> 3 & 1);
      bVar4 = (bool)(bVar28 >> 4 & 1);
      bVar5 = (bool)(bVar28 >> 5 & 1);
      bVar6 = (bool)(bVar28 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(bVar28 & 1) * -0x800000 | (uint)!(bool)(bVar28 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar33 * -0x800000 | (uint)!bVar33 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar32 * -0x800000 | (uint)!bVar32 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(bVar28 >> 7) * -0x800000 | (uint)!(bool)(bVar28 >> 7) * *(int *)(ray + 0x11c);
    }
  }
  return;
code_r0x007b979d:
  uVar23 = uVar35 & 0xfffffffffffffff0;
  auVar48 = ZEXT3264(auVar59._0_32_);
  uVar24 = 0;
  uVar35 = 8;
  do {
    uVar2 = *(ulong *)(uVar23 + uVar24 * 8);
    if (uVar2 != 8) {
      uVar1 = *(undefined4 *)(uVar23 + 0x80 + uVar24 * 4);
      auVar49._4_4_ = uVar1;
      auVar49._0_4_ = uVar1;
      auVar49._8_4_ = uVar1;
      auVar49._12_4_ = uVar1;
      auVar49._16_4_ = uVar1;
      auVar49._20_4_ = uVar1;
      auVar49._24_4_ = uVar1;
      auVar49._28_4_ = uVar1;
      auVar40 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar1 = *(undefined4 *)(uVar23 + 0x20 + uVar24 * 4);
      auVar37._4_4_ = uVar1;
      auVar37._0_4_ = uVar1;
      auVar37._8_4_ = uVar1;
      auVar37._12_4_ = uVar1;
      auVar37._16_4_ = uVar1;
      auVar37._20_4_ = uVar1;
      auVar37._24_4_ = uVar1;
      auVar37._28_4_ = uVar1;
      auVar37 = vfmadd213ps_avx512vl(auVar49,auVar40,auVar37);
      uVar1 = *(undefined4 *)(uVar23 + 0xa0 + uVar24 * 4);
      auVar50._4_4_ = uVar1;
      auVar50._0_4_ = uVar1;
      auVar50._8_4_ = uVar1;
      auVar50._12_4_ = uVar1;
      auVar50._16_4_ = uVar1;
      auVar50._20_4_ = uVar1;
      auVar50._24_4_ = uVar1;
      auVar50._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar23 + 0x40 + uVar24 * 4);
      auVar16._4_4_ = uVar1;
      auVar16._0_4_ = uVar1;
      auVar16._8_4_ = uVar1;
      auVar16._12_4_ = uVar1;
      auVar16._16_4_ = uVar1;
      auVar16._20_4_ = uVar1;
      auVar16._24_4_ = uVar1;
      auVar16._28_4_ = uVar1;
      auVar38 = vfmadd213ps_avx512vl(auVar50,auVar40,auVar16);
      uVar1 = *(undefined4 *)(uVar23 + 0xc0 + uVar24 * 4);
      auVar51._4_4_ = uVar1;
      auVar51._0_4_ = uVar1;
      auVar51._8_4_ = uVar1;
      auVar51._12_4_ = uVar1;
      auVar51._16_4_ = uVar1;
      auVar51._20_4_ = uVar1;
      auVar51._24_4_ = uVar1;
      auVar51._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar23 + 0x60 + uVar24 * 4);
      auVar17._4_4_ = uVar1;
      auVar17._0_4_ = uVar1;
      auVar17._8_4_ = uVar1;
      auVar17._12_4_ = uVar1;
      auVar17._16_4_ = uVar1;
      auVar17._20_4_ = uVar1;
      auVar17._24_4_ = uVar1;
      auVar17._28_4_ = uVar1;
      auVar41 = vfmadd213ps_avx512vl(auVar51,auVar40,auVar17);
      uVar1 = *(undefined4 *)(uVar23 + 0x90 + uVar24 * 4);
      auVar52._4_4_ = uVar1;
      auVar52._0_4_ = uVar1;
      auVar52._8_4_ = uVar1;
      auVar52._12_4_ = uVar1;
      auVar52._16_4_ = uVar1;
      auVar52._20_4_ = uVar1;
      auVar52._24_4_ = uVar1;
      auVar52._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar23 + 0x30 + uVar24 * 4);
      auVar18._4_4_ = uVar1;
      auVar18._0_4_ = uVar1;
      auVar18._8_4_ = uVar1;
      auVar18._12_4_ = uVar1;
      auVar18._16_4_ = uVar1;
      auVar18._20_4_ = uVar1;
      auVar18._24_4_ = uVar1;
      auVar18._28_4_ = uVar1;
      auVar42 = vfmadd213ps_avx512vl(auVar52,auVar40,auVar18);
      uVar1 = *(undefined4 *)(uVar23 + 0xb0 + uVar24 * 4);
      auVar53._4_4_ = uVar1;
      auVar53._0_4_ = uVar1;
      auVar53._8_4_ = uVar1;
      auVar53._12_4_ = uVar1;
      auVar53._16_4_ = uVar1;
      auVar53._20_4_ = uVar1;
      auVar53._24_4_ = uVar1;
      auVar53._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar23 + 0x50 + uVar24 * 4);
      auVar19._4_4_ = uVar1;
      auVar19._0_4_ = uVar1;
      auVar19._8_4_ = uVar1;
      auVar19._12_4_ = uVar1;
      auVar19._16_4_ = uVar1;
      auVar19._20_4_ = uVar1;
      auVar19._24_4_ = uVar1;
      auVar19._28_4_ = uVar1;
      auVar43 = vfmadd213ps_avx512vl(auVar53,auVar40,auVar19);
      uVar1 = *(undefined4 *)(uVar23 + 0xd0 + uVar24 * 4);
      auVar55._4_4_ = uVar1;
      auVar55._0_4_ = uVar1;
      auVar55._8_4_ = uVar1;
      auVar55._12_4_ = uVar1;
      auVar55._16_4_ = uVar1;
      auVar55._20_4_ = uVar1;
      auVar55._24_4_ = uVar1;
      auVar55._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(uVar23 + 0x70 + uVar24 * 4);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar20._16_4_ = uVar1;
      auVar20._20_4_ = uVar1;
      auVar20._24_4_ = uVar1;
      auVar20._28_4_ = uVar1;
      auVar44 = vfmadd213ps_avx512vl(auVar55,auVar40,auVar20);
      auVar45 = vfmadd213ps_avx512vl(auVar37,local_2660,local_2700);
      auVar46 = vfmadd213ps_avx512vl(auVar38,local_2680,local_2720);
      auVar47 = vfmadd213ps_avx512vl(auVar41,local_26a0,local_2740);
      auVar41 = vfmadd213ps_avx512vl(auVar42,local_2660,local_2700);
      auVar42 = vfmadd213ps_avx512vl(auVar43,local_2680,local_2720);
      auVar43 = vfmadd213ps_avx512vl(auVar44,local_26a0,local_2740);
      auVar37 = vpminsd_avx2(auVar45,auVar41);
      auVar38 = vpminsd_avx2(auVar46,auVar42);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vpminsd_avx2(auVar47,auVar43);
      auVar37 = vpmaxsd_avx2(auVar37,auVar38);
      auVar38 = vpmaxsd_avx2(auVar45,auVar41);
      auVar41 = vpmaxsd_avx2(auVar46,auVar42);
      auVar42 = vpminsd_avx2(auVar38,auVar41);
      auVar38 = vpmaxsd_avx2(auVar47,auVar43);
      auVar41 = vpmaxsd_avx2(auVar37,local_26c0);
      auVar38 = vpminsd_avx512vl(auVar38,local_26e0);
      auVar38 = vpminsd_avx2(auVar42,auVar38);
      uVar36 = vcmpps_avx512vl(auVar41,auVar38,2);
      if ((uVar29 & 7) == 6) {
        uVar1 = *(undefined4 *)(uVar23 + 0xe0 + uVar24 * 4);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        uVar11 = vcmpps_avx512vl(auVar40,auVar21,0xd);
        uVar1 = *(undefined4 *)(uVar23 + 0xf0 + uVar24 * 4);
        auVar22._4_4_ = uVar1;
        auVar22._0_4_ = uVar1;
        auVar22._8_4_ = uVar1;
        auVar22._12_4_ = uVar1;
        auVar22._16_4_ = uVar1;
        auVar22._20_4_ = uVar1;
        auVar22._24_4_ = uVar1;
        auVar22._28_4_ = uVar1;
        uVar12 = vcmpps_avx512vl(auVar40,auVar22,1);
        uVar36 = uVar36 & uVar11 & uVar12;
      }
      uVar11 = vcmpps_avx512vl(local_26e0,auVar39,6);
      uVar36 = uVar36 & uVar11;
      if ((byte)uVar36 != 0) {
        auVar37 = vblendmps_avx512vl(auVar59._0_32_,auVar37);
        bVar32 = (bool)((byte)uVar36 & 1);
        bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar36 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar36 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar36 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar36 >> 6) & 1);
        bVar9 = SUB81(uVar36 >> 7,0);
        if (uVar35 != 8) {
          *puVar30 = uVar35;
          puVar30 = puVar30 + 1;
          *pauVar31 = auVar48._0_32_;
          pauVar31 = pauVar31 + 1;
        }
        auVar48 = ZEXT3264(CONCAT428((uint)bVar9 * auVar37._28_4_ | (uint)!bVar9 * auVar40._28_4_,
                                     CONCAT424((uint)bVar7 * auVar37._24_4_ |
                                               (uint)!bVar7 * auVar40._24_4_,
                                               CONCAT420((uint)bVar8 * auVar37._20_4_ |
                                                         (uint)!bVar8 * auVar40._20_4_,
                                                         CONCAT416((uint)bVar6 * auVar37._16_4_ |
                                                                   (uint)!bVar6 * auVar40._16_4_,
                                                                   CONCAT412((uint)bVar5 *
                                                                             auVar37._12_4_ |
                                                                             (uint)!bVar5 *
                                                                             auVar40._12_4_,
                                                                             CONCAT48((uint)bVar4 *
                                                                                      auVar37._8_4_
                                                                                      | (uint)!bVar4
                                                                                        * auVar40.
                                                  _8_4_,CONCAT44((uint)bVar3 * auVar37._4_4_ |
                                                                 (uint)!bVar3 * auVar40._4_4_,
                                                                 (uint)bVar32 * auVar37._0_4_ |
                                                                 (uint)!bVar32 * auVar40._0_4_))))))
                                    ));
        uVar35 = uVar2;
      }
    }
  } while ((uVar2 != 8) && (bVar32 = uVar24 < 3, uVar24 = uVar24 + 1, bVar32));
  auVar39 = auVar48._0_32_;
  if (uVar35 == 8) goto LAB_007b9910;
  goto LAB_007b9793;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }